

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiann.cpp
# Opt level: O0

void __thiscall MultiANN::AddPoint(MultiANN *this,ANNpoint x_coor,void *x_ptr)

{
  undefined8 in_RDX;
  long in_RSI;
  int *in_RDI;
  __type _Var1;
  int i;
  MultiANN *in_stack_00000048;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  int local_1c;
  
  for (local_1c = 0; local_1c < in_RDI[1]; local_1c = local_1c + 1) {
    *(undefined8 *)(*(long *)(*(long *)(in_RDI + 4) + (long)*in_RDI * 8) + (long)local_1c * 8) =
         *(undefined8 *)(in_RSI + (long)local_1c * 8);
  }
  *(undefined8 *)(*(long *)(in_RDI + 6) + (long)*in_RDI * 8) = in_RDX;
  *in_RDI = *in_RDI + 1;
  if (*in_RDI != in_RDI[2]) {
    iVar2 = *in_RDI;
    _Var1 = std::pow<double,int>
                      ((double)CONCAT44(iVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
    if (iVar2 % (int)_Var1 == 0) {
      in_RDI[2] = *in_RDI;
      UpdateAnnArray(in_stack_00000048);
    }
  }
  return;
}

Assistant:

void MultiANN::AddPoint(  // dynamic update of the data points
    ANNpoint x_coor,      // coordinates of the point
    void *x_ptr)          // pointer to the point
{
    for (int i = 0; i < dimension; i++) {
        points_coor[size][i] = x_coor[i];
    }
    points_ptr[size] = (void *)x_ptr;
    size++;

    if ((size != LastNodeCount) &&
        (size % ((int)pow((double)2, ANN_STARTING_INDEX)) ==
         0)) {  // Check if it is time to update the ANNs
        LastNodeCount = size;
        UpdateAnnArray();
    }
}